

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O0

void testing::internal::LogElementMatcherPairVec(ElementMatcherPairs *pairs,ostream *stream)

{
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_38;
  __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_30;
  Iter it;
  char *sep;
  ostream *os;
  ostream *stream_local;
  ElementMatcherPairs *pairs_local;
  
  std::operator<<(stream,"{");
  it._M_current = (pair<unsigned_long,_unsigned_long> *)0x141353;
  local_30._M_current =
       (pair<unsigned_long,_unsigned_long> *)
       std::
       vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ::begin(pairs);
  while( true ) {
    local_38._M_current =
         (pair<unsigned_long,_unsigned_long> *)
         std::
         vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ::end(pairs);
    bVar1 = __gnu_cxx::
            operator==<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                      (&local_30,&local_38);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    poVar2 = std::operator<<(stream,(char *)it._M_current);
    poVar2 = std::operator<<(poVar2,"\n  (");
    poVar2 = std::operator<<(poVar2,"element #");
    ppVar3 = __gnu_cxx::
             __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
             ::operator->(&local_30);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,ppVar3->first);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = std::operator<<(poVar2,"matcher #");
    ppVar3 = __gnu_cxx::
             __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
             ::operator->(&local_30);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,ppVar3->second);
    std::operator<<(poVar2,")");
    it._M_current = (pair<unsigned_long,_unsigned_long> *)anon_var_dwarf_19331;
    __gnu_cxx::
    __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::operator++(&local_30);
  }
  std::operator<<(stream,"\n}");
  return;
}

Assistant:

static void LogElementMatcherPairVec(const ElementMatcherPairs& pairs,
                                     ::std::ostream* stream) {
  typedef ElementMatcherPairs::const_iterator Iter;
  ::std::ostream& os = *stream;
  os << "{";
  const char* sep = "";
  for (Iter it = pairs.begin(); it != pairs.end(); ++it) {
    os << sep << "\n  ("
       << "element #" << it->first << ", "
       << "matcher #" << it->second << ")";
    sep = ",";
  }
  os << "\n}";
}